

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O2

void __thiscall
ApprovalTests::CommandReporter::CommandReporter
          (CommandReporter *this,string *command,CommandLauncher *launcher)

{
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__CommandReporter_001979f8;
  ::std::__cxx11::string::string((string *)&this->cmd,(string *)command);
  DiffInfo::getDefaultArguments_abi_cxx11_();
  this->l = launcher;
  (this->converter).super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->converter).super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  checkForCygwin(this);
  return;
}

Assistant:

CommandReporter::CommandReporter(std::string command, CommandLauncher* launcher)
        : cmd(std::move(command)), l(launcher)
    {
        checkForCygwin();
    }